

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void splev_stack_push(splevstack *st,opvar *v)

{
  opvar **__dest;
  opvar **tmp;
  opvar *v_local;
  splevstack *st_local;
  
  if ((st != (splevstack *)0x0) && (st->stackdata != (opvar **)0x0)) {
    if (st->depth_alloc <= st->depth) {
      __dest = (opvar **)malloc((st->depth_alloc + 0x80) * 8);
      memcpy(__dest,st->stackdata,st->depth_alloc << 3);
      if (st->stackdata != (opvar **)0x0) {
        free(st->stackdata);
      }
      st->stackdata = __dest;
      st->depth_alloc = st->depth_alloc + 0x80;
    }
    st->stackdata[st->depth] = v;
    st->depth = st->depth + 1;
    return;
  }
  panic("splev_stack_push: no stackdata allocated?");
}

Assistant:

static void splev_stack_push(struct splevstack *st, struct opvar *v)
{
	if (!st || !st->stackdata)
	    panic("splev_stack_push: no stackdata allocated?");

	if (st->depth >= st->depth_alloc) {
	    struct opvar **tmp = malloc((st->depth_alloc + SPLEV_STACK_RESERVE) *
				        sizeof(struct opvar *));
	    memcpy(tmp, st->stackdata, st->depth_alloc * sizeof(struct opvar *));
	    Free(st->stackdata);
	    st->stackdata = tmp;
	    st->depth_alloc += SPLEV_STACK_RESERVE;
	}

	st->stackdata[st->depth] = v;
	st->depth++;
}